

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Address.cpp
# Opt level: O1

bool __thiscall Network::Address::URL::findQueryVariable(URL *this,String *name,String *value)

{
  bool bVar1;
  bool bVar2;
  String *this_00;
  String queryClean;
  String SStack_98;
  undefined1 local_88 [16];
  String local_78;
  String local_68;
  String local_58;
  String local_48;
  String local_38;
  
  escapedURI((URL *)local_88,name,QueryOnly,true);
  Bstrlib::String::operator=(name,(String *)local_88);
  Bstrlib::String::~String((String *)local_88);
  Bstrlib::String::String((String *)local_88,&this->query);
  Bstrlib::String::midString(&SStack_98,(int)(String *)local_88,0);
  bVar1 = Bstrlib::String::operator==(&SStack_98,name);
  Bstrlib::String::~String(&SStack_98);
  if (bVar1) {
    Bstrlib::String::splitAt(&local_38,(int)local_88);
    this_00 = &local_38;
  }
  else {
    Bstrlib::operator+((char *)&local_78,(String *)"&");
    Bstrlib::String::fromFirst(&SStack_98,&this->query,SUB81(&local_78,0));
    Bstrlib::String::operator=((String *)local_88,&SStack_98);
    Bstrlib::String::~String(&SStack_98);
    this_00 = &local_78;
  }
  Bstrlib::String::~String(this_00);
  if (bVar1 || 0 < (int)local_88._4_4_) {
    if (local_88._4_4_ == 0) {
      findQueryVariable();
    }
    if (*(uchar *)local_88._8_8_ == '=') {
      Bstrlib::String::splitAt(&local_48,(int)local_88);
      Bstrlib::String::~String(&local_48);
      Bstrlib::String::String(&local_68,"&");
      Bstrlib::String::upToFirst(&local_78,(String *)local_88,SUB81(&local_68,0));
      unescapedURI((URL *)&SStack_98,&local_78);
      Bstrlib::String::operator=(value,&SStack_98);
    }
    else {
      Bstrlib::String::midString(&SStack_98,(int)local_88,0);
      bVar2 = Bstrlib::String::operator==(&SStack_98,"[]=");
      Bstrlib::String::~String(&SStack_98);
      if (!bVar2) goto LAB_0011027a;
      Bstrlib::String::splitAt(&local_58,(int)local_88);
      Bstrlib::String::~String(&local_58);
      Bstrlib::String::String(&local_68,"&");
      Bstrlib::String::upToFirst(&local_78,(String *)local_88,SUB81(&local_68,0));
      unescapedURI((URL *)&SStack_98,&local_78);
      Bstrlib::String::operator=(value,&SStack_98);
    }
    Bstrlib::String::~String(&SStack_98);
    Bstrlib::String::~String(&local_78);
    Bstrlib::String::~String(&local_68);
  }
LAB_0011027a:
  Bstrlib::String::~String((String *)local_88);
  return bVar1 || 0 < (int)local_88._4_4_;
}

Assistant:

bool URL::findQueryVariable(String name, String & value) const
        {
            name = escapedURI(name, QueryOnly);
            String queryClean = query;
            bool start = queryClean.midString(0, name.getLength()) == name;
            if (!start) queryClean = query.fromFirst("&" + name);
            else queryClean.splitAt(name.getLength());
            if ( start || queryClean )
            {
                if (queryClean[0] == '=') { queryClean.splitAt(1); value = unescapedURI(queryClean.upToFirst("&")); }
                else if (queryClean.midString(0, 2) == "[]=") { queryClean.splitAt(3); value = unescapedURI(queryClean.upToFirst("&")); }
                return true;
            }
            return false;
        }